

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_hanning_window.c
# Opt level: O3

void WebRtcSpl_GetHanningWindow(int16_t *v,size_t size)

{
  int32_t iVar1;
  int iVar2;
  size_t sVar3;
  
  iVar1 = WebRtcSpl_DivW32W16(0x40000000,(int16_t)size);
  if (size != 0) {
    iVar2 = (0x200 < size | 0xfffffffe) << 0x14;
    sVar3 = 0;
    do {
      iVar2 = iVar2 + iVar1;
      v[sVar3] = kHanningTable[iVar2 >> 0x16];
      sVar3 = sVar3 + 1;
    } while (size != sVar3);
  }
  return;
}

Assistant:

void WebRtcSpl_GetHanningWindow(int16_t *v, size_t size)
{
    size_t jj;
    int16_t *vptr1;

    int32_t index;
    int32_t factor = ((int32_t)0x40000000);

    factor = WebRtcSpl_DivW32W16(factor, (int16_t)size);
    if (size < 513)
        index = (int32_t)-0x200000;
    else
        index = (int32_t)-0x100000;
    vptr1 = v;

    for (jj = 0; jj < size; jj++)
    {
        index += factor;
        (*vptr1++) = kHanningTable[index >> 22];
    }

}